

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scope.cpp
# Opt level: O1

void __thiscall
slang::ast::Scope::insertMember
          (Scope *this,Symbol *member,Symbol *at,bool isElaborating,bool incrementIndex)

{
  char *pcVar1;
  Symbol *pSVar2;
  size_t __n;
  uint uVar3;
  uint uVar4;
  int iVar5;
  uint64_t hash;
  ulong uVar6;
  Symbol **ppSVar7;
  ulong uVar8;
  long lVar9;
  pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>
  *ppVar10;
  string_view *psVar11;
  long lVar12;
  basic_string_view<char,_std::char_traits<char>_> *sv;
  pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>
  *ppVar13;
  hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *arrays_;
  bool bVar14;
  undefined1 auVar15 [16];
  char cVar16;
  char cVar17;
  char cVar18;
  char cVar19;
  char cVar20;
  char cVar21;
  char cVar22;
  char cVar23;
  char cVar24;
  char cVar25;
  char cVar26;
  char cVar27;
  char cVar28;
  char cVar29;
  char cVar30;
  char cVar31;
  try_emplace_args_t local_c1;
  Symbol *member_local;
  ulong local_b8;
  uint64_t local_b0;
  hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *local_a8;
  basic_string_view<char,_std::char_traits<char>_> *local_a0;
  ulong local_98;
  long local_90;
  ulong local_88;
  ulong local_80;
  long local_78;
  char *local_70;
  ulong local_68;
  string_view *local_60;
  char local_58;
  char cStack_57;
  char cStack_56;
  char cStack_55;
  char cStack_54;
  char cStack_53;
  char cStack_52;
  char cStack_51;
  char cStack_50;
  char cStack_4f;
  char cStack_4e;
  char cStack_4d;
  char cStack_4c;
  char cStack_4b;
  char cStack_4a;
  char cStack_49;
  locator res;
  
  if (at == (Symbol *)0x0) {
    member->indexInScope = 1;
    ppSVar7 = &this->firstMember;
  }
  else {
    member->indexInScope = (uint)incrementIndex + at->indexInScope;
    ppSVar7 = &at->nextInScope;
  }
  pSVar2 = *ppSVar7;
  *ppSVar7 = member;
  member->nextInScope = pSVar2;
  member->parentScope = this;
  if (pSVar2 == (Symbol *)0x0) {
    this->lastMember = member;
  }
  if (((member->name)._M_len != 0) &&
     ((uVar4 = member->kind - Port, 0x3b < uVar4 ||
      ((0x800000400000203U >> ((ulong)uVar4 & 0x3f) & 1) == 0)))) {
    sv = &member->name;
    arrays_ = (hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *)this->nameMap;
    psVar11 = sv;
    member_local = member;
    hash = hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::operator()(arrays_,sv)
    ;
    uVar8 = hash >> ((byte)*arrays_ & 0x3f);
    lVar12 = *(long *)(arrays_ + 0x10);
    lVar9 = (hash & 0xff) * 4;
    cVar16 = (&UNK_0049b57c)[lVar9];
    cVar17 = (&UNK_0049b57d)[lVar9];
    cVar18 = (&UNK_0049b57e)[lVar9];
    cVar19 = (&UNK_0049b57f)[lVar9];
    uVar6 = (ulong)((uint)hash & 7);
    local_b8 = 0;
    cVar20 = cVar16;
    cVar21 = cVar17;
    cVar22 = cVar18;
    cVar23 = cVar19;
    cVar24 = cVar16;
    cVar25 = cVar17;
    cVar26 = cVar18;
    cVar27 = cVar19;
    cVar28 = cVar16;
    cVar29 = cVar17;
    cVar30 = cVar18;
    cVar31 = cVar19;
    local_80 = uVar8;
    do {
      local_78 = uVar8 * 0x10;
      pcVar1 = (char *)(lVar12 + local_78);
      auVar15[0] = -(*pcVar1 == cVar16);
      auVar15[1] = -(pcVar1[1] == cVar17);
      auVar15[2] = -(pcVar1[2] == cVar18);
      auVar15[3] = -(pcVar1[3] == cVar19);
      auVar15[4] = -(pcVar1[4] == cVar20);
      auVar15[5] = -(pcVar1[5] == cVar21);
      auVar15[6] = -(pcVar1[6] == cVar22);
      auVar15[7] = -(pcVar1[7] == cVar23);
      auVar15[8] = -(pcVar1[8] == cVar24);
      auVar15[9] = -(pcVar1[9] == cVar25);
      auVar15[10] = -(pcVar1[10] == cVar26);
      auVar15[0xb] = -(pcVar1[0xb] == cVar27);
      auVar15[0xc] = -(pcVar1[0xc] == cVar28);
      auVar15[0xd] = -(pcVar1[0xd] == cVar29);
      auVar15[0xe] = -(pcVar1[0xe] == cVar30);
      auVar15[0xf] = -(pcVar1[0xf] == cVar31);
      uVar4 = (uint)(ushort)((ushort)(SUB161(auVar15 >> 7,0) & 1) |
                             (ushort)(SUB161(auVar15 >> 0xf,0) & 1) << 1 |
                             (ushort)(SUB161(auVar15 >> 0x17,0) & 1) << 2 |
                             (ushort)(SUB161(auVar15 >> 0x1f,0) & 1) << 3 |
                             (ushort)(SUB161(auVar15 >> 0x27,0) & 1) << 4 |
                             (ushort)(SUB161(auVar15 >> 0x2f,0) & 1) << 5 |
                             (ushort)(SUB161(auVar15 >> 0x37,0) & 1) << 6 |
                             (ushort)(SUB161(auVar15 >> 0x3f,0) & 1) << 7 |
                             (ushort)(SUB161(auVar15 >> 0x47,0) & 1) << 8 |
                             (ushort)(SUB161(auVar15 >> 0x4f,0) & 1) << 9 |
                             (ushort)(SUB161(auVar15 >> 0x57,0) & 1) << 10 |
                             (ushort)(SUB161(auVar15 >> 0x5f,0) & 1) << 0xb |
                             (ushort)(SUB161(auVar15 >> 0x67,0) & 1) << 0xc |
                             (ushort)(SUB161(auVar15 >> 0x6f,0) & 1) << 0xd |
                            (ushort)(SUB161(auVar15 >> 0x77,0) & 1) << 0xe);
      local_88 = uVar8;
      if (uVar4 != 0) {
        lVar9 = *(long *)(arrays_ + 0x18);
        __n = (member->name)._M_len;
        local_70 = (member->name)._M_str;
        local_b0 = hash;
        local_a8 = arrays_;
        local_a0 = sv;
        local_98 = uVar6;
        local_90 = lVar12;
        local_58 = cVar16;
        cStack_57 = cVar17;
        cStack_56 = cVar18;
        cStack_55 = cVar19;
        cStack_54 = cVar20;
        cStack_53 = cVar21;
        cStack_52 = cVar22;
        cStack_51 = cVar23;
        cStack_50 = cVar24;
        cStack_4f = cVar25;
        cStack_4e = cVar26;
        cStack_4d = cVar27;
        cStack_4c = cVar28;
        cStack_4b = cVar29;
        cStack_4a = cVar30;
        cStack_49 = cVar31;
        do {
          uVar3 = 0;
          if (uVar4 != 0) {
            for (; (uVar4 >> uVar3 & 1) == 0; uVar3 = uVar3 + 1) {
            }
          }
          ppVar13 = (pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>
                     *)((ulong)uVar3 * 0x18 + lVar9 + uVar8 * 0x168);
          bVar14 = __n == (ppVar13->first)._M_len;
          uVar6 = (ulong)uVar4;
          if (bVar14 && __n != 0) {
            local_68 = (ulong)uVar4;
            local_60 = psVar11;
            iVar5 = bcmp(local_70,(ppVar13->first)._M_str,__n);
            bVar14 = iVar5 == 0;
            psVar11 = local_60;
            uVar6 = local_68;
            cVar16 = local_58;
            cVar17 = cStack_57;
            cVar18 = cStack_56;
            cVar19 = cStack_55;
            cVar20 = cStack_54;
            cVar21 = cStack_53;
            cVar22 = cStack_52;
            cVar23 = cStack_51;
            cVar24 = cStack_50;
            cVar25 = cStack_4f;
            cVar26 = cStack_4e;
            cVar27 = cStack_4d;
            cVar28 = cStack_4c;
            cVar29 = cStack_4b;
            cVar30 = cStack_4a;
            cVar31 = cStack_49;
          }
          hash = local_b0;
          sv = local_a0;
          arrays_ = local_a8;
          if (bVar14) goto LAB_0033b7c7;
          uVar4 = (uint)uVar6 - 1 & (uint)uVar6;
          uVar6 = local_98;
          lVar12 = local_90;
        } while (uVar4 != 0);
      }
      if ((*(byte *)(local_78 + lVar12 + 0xf) &
          (&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
            is_not_overflowed(unsigned_long)::shift)[uVar6]) == 0) break;
      lVar9 = local_88 + local_b8;
      local_b8 = local_b8 + 1;
      uVar8 = lVar9 + 1U & *(ulong *)(arrays_ + 8);
    } while (local_b8 <= *(ulong *)(arrays_ + 8));
    ppVar13 = (pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>
               *)0x0;
LAB_0033b7c7:
    ppVar10 = ppVar13;
    if (ppVar13 ==
        (pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>
         *)0x0) {
      if (*(ulong *)((table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Symbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ast::Symbol_const*>>>
                      *)arrays_ + 0x28) <
          *(ulong *)((table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Symbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ast::Symbol_const*>>>
                      *)arrays_ + 0x20)) {
        boost::unordered::detail::foa::
        table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Symbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ast::Symbol_const*>>>
        ::
        nosize_unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>const&,slang::ast::Symbol_const*&>
                  (&res,(table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Symbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ast::Symbol_const*>>>
                         *)arrays_,(arrays_type *)arrays_,local_80,hash,&local_c1,sv,&member_local);
        *(long *)((table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Symbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ast::Symbol_const*>>>
                   *)arrays_ + 0x28) =
             *(long *)((table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Symbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ast::Symbol_const*>>>
                        *)arrays_ + 0x28) + 1;
        ppVar10 = res.p;
      }
      else {
        boost::unordered::detail::foa::
        table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Symbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ast::Symbol_const*>>>
        ::
        unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>const&,slang::ast::Symbol_const*&>
                  (&res,(table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Symbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ast::Symbol_const*>>>
                         *)arrays_,hash,&local_c1,sv,&member_local);
        ppVar10 = res.p;
      }
    }
    if (ppVar13 !=
        (pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>
         *)0x0) {
      handleNameConflict(this,member_local,&ppVar10->second,isElaborating);
    }
  }
  return;
}

Assistant:

void Scope::insertMember(const Symbol* member, const Symbol* at, bool isElaborating,
                         bool incrementIndex) const {
    SLANG_ASSERT(!member->parentScope);
    SLANG_ASSERT(!member->nextInScope);

    if (!at) {
        member->indexInScope = SymbolIndex{1};
        member->nextInScope = std::exchange(firstMember, member);
    }
    else {
        member->indexInScope = at->indexInScope + (incrementIndex ? 1 : 0);
        member->nextInScope = std::exchange(at->nextInScope, member);
    }

    member->parentScope = this;
    if (!member->nextInScope)
        lastMember = member;

    // Add to the name map if the symbol has a name and can be looked up
    // by name in the default namespace.
    if (!member->name.empty() && canLookupByName(member->kind)) {
        auto pair = nameMap->emplace(member->name, member);
        if (!pair.second)
            handleNameConflict(*member, pair.first->second, isElaborating);
    }
}